

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

qpdf_data qpdf_init(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _qpdf_data *this_00;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  this_00 = (_qpdf_data *)operator_new(0x148);
  memset(this_00,0,0x148);
  _qpdf_data::_qpdf_data(this_00);
  QPDF::create();
  this = (this_00->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this_00->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  (this_00->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_20;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return this_00;
}

Assistant:

qpdf_data
qpdf_init()
{
    QTC::TC("qpdf", "qpdf-c called qpdf_init");
    auto qpdf = new _qpdf_data();
    qpdf->qpdf = QPDF::create();
    return qpdf;
}